

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int btreeComputeFreeSpace(MemPage *pPage)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  u8 *puVar5;
  bool bVar6;
  int iVar7;
  ushort uVar8;
  undefined8 uVar9;
  uint uVar10;
  uint uVar11;
  ushort uVar12;
  int iVar13;
  
  puVar5 = pPage->aData;
  uVar4 = pPage->pBt->usableSize;
  bVar1 = pPage->hdrOffset;
  uVar10 = ((uint)puVar5[(ulong)bVar1 + 5] * 0x100 + (uint)puVar5[(ulong)bVar1 + 6]) - 1 & 0xffff;
  bVar2 = pPage->childPtrSize;
  uVar8 = *(ushort *)(puVar5 + (ulong)bVar1 + 1) << 8 | *(ushort *)(puVar5 + (ulong)bVar1 + 1) >> 8;
  uVar3 = pPage->nCell;
  iVar13 = uVar10 + puVar5[(ulong)bVar1 + 7] + 1;
  if (uVar8 == 0) goto LAB_001478f8;
  uVar9 = 0x10cfe;
  if (uVar10 < uVar8) {
    uVar10 = (uint)uVar8;
    do {
      uVar11 = uVar10;
      if ((int)(uVar4 - 4) < (int)uVar11) {
        uVar9 = 0x10d03;
        goto LAB_001478c6;
      }
      uVar8 = *(ushort *)(puVar5 + uVar11) << 8 | *(ushort *)(puVar5 + uVar11) >> 8;
      uVar12 = *(ushort *)(puVar5 + (ulong)uVar11 + 2) << 8 |
               *(ushort *)(puVar5 + (ulong)uVar11 + 2) >> 8;
      iVar13 = iVar13 + (uint)uVar12;
      uVar10 = (uint)uVar8;
    } while (uVar12 + uVar11 + 3 < (uint)uVar8);
    uVar9 = 0x10d0d;
    if (uVar8 != 0) goto LAB_001478c6;
    bVar6 = true;
    uVar9 = 0x10d11;
    if (uVar4 < uVar12 + uVar11) goto LAB_001478c6;
  }
  else {
LAB_001478c6:
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar9,
                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
    bVar6 = false;
  }
  if (!bVar6) {
    return 0xb;
  }
LAB_001478f8:
  if (((int)uVar4 < iVar13) ||
     (iVar7 = (uint)bVar1 + (uint)bVar2 + (uint)uVar3 * 2 + 8, iVar13 < iVar7)) {
    iVar13 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10d1d,
                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
  }
  else {
    pPage->nFree = iVar13 - iVar7 & 0xffff;
    iVar13 = 0;
  }
  return iVar13;
}

Assistant:

static int btreeComputeFreeSpace(MemPage *pPage){
  int pc;            /* Address of a freeblock within pPage->aData[] */
  u8 hdr;            /* Offset to beginning of page header */
  u8 *data;          /* Equal to pPage->aData */
  int usableSize;    /* Amount of usable space on each page */
  int nFree;         /* Number of unused bytes on the page */
  int top;           /* First byte of the cell content area */
  int iCellFirst;    /* First allowable cell or freeblock offset */
  int iCellLast;     /* Last possible cell or freeblock offset */

  assert( pPage->pBt!=0 );
  assert( pPage->pBt->db!=0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->pgno==sqlite3PagerPagenumber(pPage->pDbPage) );
  assert( pPage == sqlite3PagerGetExtra(pPage->pDbPage) );
  assert( pPage->aData == sqlite3PagerGetData(pPage->pDbPage) );
  assert( pPage->isInit==1 );
  assert( pPage->nFree<0 );

  usableSize = pPage->pBt->usableSize;
  hdr = pPage->hdrOffset;
  data = pPage->aData;
  /* EVIDENCE-OF: R-58015-48175 The two-byte integer at offset 5 designates
  ** the start of the cell content area. A zero value for this integer is
  ** interpreted as 65536. */
  top = get2byteNotZero(&data[hdr+5]);
  iCellFirst = hdr + 8 + pPage->childPtrSize + 2*pPage->nCell;
  iCellLast = usableSize - 4;

  /* Compute the total free space on the page
  ** EVIDENCE-OF: R-23588-34450 The two-byte integer at offset 1 gives the
  ** start of the first freeblock on the page, or is zero if there are no
  ** freeblocks. */
  pc = get2byte(&data[hdr+1]);
  nFree = data[hdr+7] + top;  /* Init nFree to non-freeblock free space */
  if( pc>0 ){
    u32 next, size;
    if( pc<top ){
      /* EVIDENCE-OF: R-55530-52930 In a well-formed b-tree page, there will
      ** always be at least one cell before the first freeblock.
      */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    while( 1 ){
      if( pc>iCellLast ){
        /* Freeblock off the end of the page */
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      next = get2byte(&data[pc]);
      size = get2byte(&data[pc+2]);
      nFree = nFree + size;
      if( next<=pc+size+3 ) break;
      pc = next;
    }
    if( next>0 ){
      /* Freeblock not in ascending order */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    if( pc+size>(unsigned int)usableSize ){
      /* Last freeblock extends past page end */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
  }

  /* At this point, nFree contains the sum of the offset to the start
  ** of the cell-content area plus the number of free bytes within
  ** the cell-content area. If this is greater than the usable-size
  ** of the page, then the page must be corrupted. This check also
  ** serves to verify that the offset to the start of the cell-content
  ** area, according to the page header, lies within the page.
  */
  if( nFree>usableSize || nFree<iCellFirst ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  pPage->nFree = (u16)(nFree - iCellFirst);
  return SQLITE_OK;
}